

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O3

SPIRFunctionPrototype * __thiscall
spirv_cross::ObjectPool<spirv_cross::SPIRFunctionPrototype>::
allocate<spirv_cross::SPIRFunctionPrototype&>
          (ObjectPool<spirv_cross::SPIRFunctionPrototype> *this,SPIRFunctionPrototype *p)

{
  Vector<spirv_cross::SPIRFunctionPrototype_*> *this_00;
  _Tuple_impl<0UL,_spirv_cross::SPIRFunctionPrototype_*,_spirv_cross::ObjectPool<spirv_cross::SPIRFunctionPrototype>::MallocDeleter>
  _Var1;
  size_t sVar2;
  ulong count;
  _Head_base<0UL,_spirv_cross::SPIRFunctionPrototype_*,_false> _Var3;
  SPIRFunctionPrototype *pSVar4;
  
  this_00 = &this->vacants;
  sVar2 = (this->vacants).super_VectorView<spirv_cross::SPIRFunctionPrototype_*>.buffer_size;
  if (sVar2 == 0) {
    count = (ulong)(this->start_object_count <<
                   ((byte)(this->memory).
                          super_VectorView<std::unique_ptr<spirv_cross::SPIRFunctionPrototype,_spirv_cross::ObjectPool<spirv_cross::SPIRFunctionPrototype>::MallocDeleter>_>
                          .buffer_size & 0x1f));
    _Var1.super__Head_base<0UL,_spirv_cross::SPIRFunctionPrototype_*,_false>._M_head_impl =
         (_Head_base<0UL,_spirv_cross::SPIRFunctionPrototype_*,_false>)malloc(count * 0x48);
    if (_Var1.super__Head_base<0UL,_spirv_cross::SPIRFunctionPrototype_*,_false>._M_head_impl ==
        (SPIRFunctionPrototype *)0x0) {
      return (SPIRFunctionPrototype *)0x0;
    }
    SmallVector<spirv_cross::SPIRFunctionPrototype_*,_0UL>::reserve(this_00,count);
    if (count != 0) {
      sVar2 = (this->vacants).super_VectorView<spirv_cross::SPIRFunctionPrototype_*>.buffer_size;
      _Var3._M_head_impl =
           (SPIRFunctionPrototype *)
           _Var1.super__Head_base<0UL,_spirv_cross::SPIRFunctionPrototype_*,_false>._M_head_impl;
      do {
        SmallVector<spirv_cross::SPIRFunctionPrototype_*,_0UL>::reserve(this_00,sVar2 + 1);
        sVar2 = (this->vacants).super_VectorView<spirv_cross::SPIRFunctionPrototype_*>.buffer_size;
        (this->vacants).super_VectorView<spirv_cross::SPIRFunctionPrototype_*>.ptr[sVar2] =
             _Var3._M_head_impl;
        sVar2 = sVar2 + 1;
        (this->vacants).super_VectorView<spirv_cross::SPIRFunctionPrototype_*>.buffer_size = sVar2;
        _Var3._M_head_impl = _Var3._M_head_impl + 1;
        count = count - 1;
      } while (count != 0);
    }
    SmallVector<std::unique_ptr<spirv_cross::SPIRFunctionPrototype,_spirv_cross::ObjectPool<spirv_cross::SPIRFunctionPrototype>::MallocDeleter>,_8UL>
    ::reserve(&this->memory,
              (this->memory).
              super_VectorView<std::unique_ptr<spirv_cross::SPIRFunctionPrototype,_spirv_cross::ObjectPool<spirv_cross::SPIRFunctionPrototype>::MallocDeleter>_>
              .buffer_size + 1);
    sVar2 = (this->memory).
            super_VectorView<std::unique_ptr<spirv_cross::SPIRFunctionPrototype,_spirv_cross::ObjectPool<spirv_cross::SPIRFunctionPrototype>::MallocDeleter>_>
            .buffer_size;
    (this->memory).
    super_VectorView<std::unique_ptr<spirv_cross::SPIRFunctionPrototype,_spirv_cross::ObjectPool<spirv_cross::SPIRFunctionPrototype>::MallocDeleter>_>
    .ptr[sVar2]._M_t.
    super___uniq_ptr_impl<spirv_cross::SPIRFunctionPrototype,_spirv_cross::ObjectPool<spirv_cross::SPIRFunctionPrototype>::MallocDeleter>
    ._M_t.
    super__Tuple_impl<0UL,_spirv_cross::SPIRFunctionPrototype_*,_spirv_cross::ObjectPool<spirv_cross::SPIRFunctionPrototype>::MallocDeleter>
    .super__Head_base<0UL,_spirv_cross::SPIRFunctionPrototype_*,_false> =
         _Var1.super__Head_base<0UL,_spirv_cross::SPIRFunctionPrototype_*,_false>._M_head_impl;
    (this->memory).
    super_VectorView<std::unique_ptr<spirv_cross::SPIRFunctionPrototype,_spirv_cross::ObjectPool<spirv_cross::SPIRFunctionPrototype>::MallocDeleter>_>
    .buffer_size = sVar2 + 1;
    sVar2 = (this->vacants).super_VectorView<spirv_cross::SPIRFunctionPrototype_*>.buffer_size;
    pSVar4 = (this->vacants).super_VectorView<spirv_cross::SPIRFunctionPrototype_*>.ptr[sVar2 - 1];
    if (sVar2 == 0) goto LAB_0029f4da;
  }
  else {
    pSVar4 = (this_00->super_VectorView<spirv_cross::SPIRFunctionPrototype_*>).ptr[sVar2 - 1];
  }
  SmallVector<spirv_cross::SPIRFunctionPrototype_*,_0UL>::resize(this_00,sVar2 - 1);
LAB_0029f4da:
  (pSVar4->super_IVariant).self.id = (p->super_IVariant).self.id;
  (pSVar4->super_IVariant)._vptr_IVariant = (_func_int **)&PTR__SPIRFunctionPrototype_0035d9c8;
  *(undefined4 *)&(pSVar4->super_IVariant).field_0xc = *(undefined4 *)&(p->super_IVariant).field_0xc
  ;
  (pSVar4->parameter_types).super_VectorView<unsigned_int>.buffer_size = 0;
  (pSVar4->parameter_types).super_VectorView<unsigned_int>.ptr =
       (uint *)&(pSVar4->parameter_types).stack_storage;
  (pSVar4->parameter_types).buffer_capacity = 8;
  SmallVector<unsigned_int,_8UL>::operator=(&pSVar4->parameter_types,&p->parameter_types);
  return pSVar4;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			vacants.reserve(num_objects);
			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}